

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

void __thiscall Vault::Config::Config(Config *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_41;
  char *local_40;
  size_type local_38;
  char local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  this->tls_ = true;
  this->debug_ = false;
  this->verify_ = true;
  (this->connectTimeout_).value_ = 10;
  (this->requestTimeout_).value_ = 10;
  (this->lowSpeedTimeout_).value_ = 10;
  (this->lowSpeedLimit_).value_ = 0x3c;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"localhost",&local_41);
  paVar1 = &(this->host_).value_.field_2;
  (this->host_).value_._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    *(undefined8 *)((long)&(this->host_).value_.field_2 + 8) = uStack_28;
  }
  else {
    (this->host_).value_._M_dataplus._M_p = local_40;
    paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
  }
  (this->host_).value_._M_string_length = local_38;
  local_38 = 0;
  local_30 = '\0';
  local_40 = &local_30;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"8200",&local_41);
  paVar1 = &(this->port_).value_.field_2;
  (this->port_).value_._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    *(undefined8 *)((long)&(this->port_).value_.field_2 + 8) = uStack_28;
  }
  else {
    (this->port_).value_._M_dataplus._M_p = local_40;
    paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
  }
  (this->port_).value_._M_string_length = local_38;
  local_38 = 0;
  local_30 = '\0';
  local_40 = &local_30;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  paVar1 = &(this->ns_).value_.field_2;
  (this->ns_).value_._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    *(undefined8 *)((long)&(this->ns_).value_.field_2 + 8) = uStack_28;
  }
  else {
    (this->ns_).value_._M_dataplus._M_p = local_40;
    (this->ns_).value_.field_2._M_allocated_capacity = CONCAT71(uStack_2f,local_30);
  }
  (this->ns_).value_._M_string_length = local_38;
  local_38 = 0;
  local_30 = '\0';
  local_40 = &local_30;
  std::__cxx11::string::~string((string *)&local_40);
  Catch::clara::std::filesystem::__cxx11::path::path(&this->caBundle_);
  return;
}

Assistant:

Config()
      : tls_(true), debug_(false), verify_(true), connectTimeout_(Timeout{10}),
        requestTimeout_(Timeout{10}), lowSpeedTimeout_(Timeout{10}),
        lowSpeedLimit_(Threshold{60}), host_(Host{"localhost"}),
        port_(Port{"8200"}), ns_(""), caBundle_() {}